

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::SplitterBehavior
               (ImRect *bb,ImGuiID id,ImGuiAxis axis,float *size1,float *size2,float min_size1,
               float min_size2,float hover_extend,float hover_visibility_delay)

{
  ImGuiItemStatusFlags *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImU32 col;
  ImGuiCol idx;
  undefined1 uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  bool held;
  bool hovered;
  float local_8c;
  float local_88;
  float local_84;
  float *local_80;
  ImVec2 local_78;
  ImVec2 aIStack_70 [2];
  ImGuiWindow *local_60;
  ImRect local_58;
  float local_48;
  
  pIVar2 = GImGui;
  local_60 = GImGui->CurrentWindow;
  local_8c = hover_visibility_delay;
  local_88 = min_size1;
  local_84 = min_size2;
  local_80 = size2;
  local_48 = hover_extend;
  bVar3 = ItemAdd(bb,id,(ImRect *)0x0,8);
  uVar4 = 0;
  if (bVar3) {
    fVar7 = (float)((uint)local_48 & (int)((uint)(axis == ImGuiAxis_Y) << 0x1f) >> 0x1f);
    fVar6 = (float)(~((int)((uint)(axis == ImGuiAxis_Y) << 0x1f) >> 0x1f) & (uint)local_48);
    local_58.Min.x = (bb->Min).x;
    local_58.Min.y = (bb->Min).y;
    local_58.Max.x = (bb->Max).x;
    local_58.Max.y = (bb->Max).y;
    local_58.Min.y = local_58.Min.y - fVar7;
    local_58.Min.x = local_58.Min.x - fVar6;
    local_58.Max.y = fVar7 + local_58.Max.y;
    local_58.Max.x = fVar6 + local_58.Max.x;
    ButtonBehavior(&local_58,id,&hovered,&held,0x1800);
    if (hovered == true) {
      pIVar1 = &(pIVar2->LastItemData).StatusFlags;
      *(byte *)pIVar1 = (byte)*pIVar1 | 1;
    }
    if (pIVar2->ActiveId != id) {
      SetItemAllowOverlap();
    }
    if ((held != false) ||
       (((hovered == true && (pIVar2->HoveredIdPreviousFrame == id)) &&
        (local_8c <= pIVar2->HoveredIdTimer)))) {
      SetMouseCursor((axis != ImGuiAxis_Y) + 3);
    }
    local_78 = bb->Min;
    aIStack_70[0] = bb->Max;
    if ((held & 1U) != 0) {
      if (axis == ImGuiAxis_Y) {
        fVar6 = ((pIVar2->IO).MousePos.y - (pIVar2->ActiveIdClickOffset).y) - local_58.Min.y;
      }
      else {
        fVar6 = ((pIVar2->IO).MousePos.x - (pIVar2->ActiveIdClickOffset).x) - local_58.Min.x;
      }
      fVar8 = *size1 - local_88;
      fVar7 = (float)(~-(uint)(*local_80 - local_84 <= 0.0) & (uint)(*local_80 - local_84));
      fVar9 = -fVar8;
      uVar5 = -(uint)(fVar8 <= fVar9);
      fVar8 = (float)(~uVar5 & (uint)fVar9 | uVar5 & 0x80000000);
      if (fVar8 <= fVar6) {
        fVar8 = fVar6;
      }
      if (fVar8 <= fVar7) {
        fVar7 = fVar8;
      }
      if ((fVar7 != 0.0) || (NAN(fVar7))) {
        *size1 = *size1 + fVar7;
        *local_80 = *local_80 - fVar7;
        fVar6 = (float)((uint)fVar7 & (int)((uint)(axis == ImGuiAxis_X) << 0x1f) >> 0x1f);
        fVar7 = (float)(~((int)((uint)(axis == ImGuiAxis_X) << 0x1f) >> 0x1f) & (uint)fVar7);
        local_78.y = fVar7 + local_78.y;
        local_78.x = fVar6 + local_78.x;
        aIStack_70[0].y = fVar7 + aIStack_70[0].y;
        aIStack_70[0].x = fVar6 + aIStack_70[0].x;
        MarkItemEdited(id);
      }
    }
    if ((held & 1U) == 0) {
      if (hovered == true) {
        idx = 0x1c - (uint)(pIVar2->HoveredIdTimer < local_8c);
      }
      else {
        idx = 0x1b;
      }
    }
    else {
      idx = 0x1d;
    }
    col = GetColorU32(idx,1.0);
    ImDrawList::AddRectFilled(local_60->DrawList,&local_78,aIStack_70,col,0.0,0);
    uVar4 = held;
  }
  return (bool)uVar4;
}

Assistant:

bool ImGui::SplitterBehavior(const ImRect& bb, ImGuiID id, ImGuiAxis axis, float* size1, float* size2, float min_size1, float min_size2, float hover_extend, float hover_visibility_delay)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (!ItemAdd(bb, id, NULL, ImGuiItemFlags_NoNav))
        return false;

    bool hovered, held;
    ImRect bb_interact = bb;
    bb_interact.Expand(axis == ImGuiAxis_Y ? ImVec2(0.0f, hover_extend) : ImVec2(hover_extend, 0.0f));
    ButtonBehavior(bb_interact, id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap);
    if (hovered)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredRect; // for IsItemHovered(), because bb_interact is larger than bb
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    if (held || (hovered && g.HoveredIdPreviousFrame == id && g.HoveredIdTimer >= hover_visibility_delay))
        SetMouseCursor(axis == ImGuiAxis_Y ? ImGuiMouseCursor_ResizeNS : ImGuiMouseCursor_ResizeEW);

    ImRect bb_render = bb;
    if (held)
    {
        ImVec2 mouse_delta_2d = g.IO.MousePos - g.ActiveIdClickOffset - bb_interact.Min;
        float mouse_delta = (axis == ImGuiAxis_Y) ? mouse_delta_2d.y : mouse_delta_2d.x;

        // Minimum pane size
        float size_1_maximum_delta = ImMax(0.0f, *size1 - min_size1);
        float size_2_maximum_delta = ImMax(0.0f, *size2 - min_size2);
        if (mouse_delta < -size_1_maximum_delta)
            mouse_delta = -size_1_maximum_delta;
        if (mouse_delta > size_2_maximum_delta)
            mouse_delta = size_2_maximum_delta;

        // Apply resize
        if (mouse_delta != 0.0f)
        {
            if (mouse_delta < 0.0f)
                IM_ASSERT(*size1 + mouse_delta >= min_size1);
            if (mouse_delta > 0.0f)
                IM_ASSERT(*size2 - mouse_delta >= min_size2);
            *size1 += mouse_delta;
            *size2 -= mouse_delta;
            bb_render.Translate((axis == ImGuiAxis_X) ? ImVec2(mouse_delta, 0.0f) : ImVec2(0.0f, mouse_delta));
            MarkItemEdited(id);
        }
    }

    // Render
    const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : (hovered && g.HoveredIdTimer >= hover_visibility_delay) ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
    window->DrawList->AddRectFilled(bb_render.Min, bb_render.Max, col, 0.0f);

    return held;
}